

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
          (DeepScanLineInputFile *this,char *rawPixelData,DeepFrameBuffer *frameBuffer,int scanLine1
          ,int scanLine2)

{
  uint uVar1;
  Data *pDVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  size_t sVar7;
  Compression *pCVar8;
  Compressor *pCVar9;
  Slice *pSVar10;
  ostream *poVar11;
  ArgExc *pAVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  ulong maxScanLineSize;
  char b [4];
  char *readPtr;
  int local_1c4;
  DeepScanLineInputFile *local_1c0;
  char *local_1b8 [2];
  ostream local_1a8 [376];
  
  uVar1 = *(uint *)rawPixelData;
  pDVar2 = this->_data;
  iVar18 = uVar1 + pDVar2->linesInBuffer + -1;
  if (pDVar2->maxY < iVar18) {
    iVar18 = pDVar2->maxY;
  }
  local_1c0 = this;
  if (uVar1 == scanLine1) {
    if (iVar18 == scanLine2) {
      uVar3 = *(ulong *)(rawPixelData + 4);
      maxScanLineSize =
           (ulong)(int)(((iVar18 - uVar1) * 4 + 4) * ((pDVar2->maxX - pDVar2->minX) + 1));
      if (uVar3 < maxScanLineSize) {
        pCVar8 = Header::compression(&pDVar2->header);
        pCVar9 = newCompressor(*pCVar8,maxScanLineSize,&local_1c0->_data->header);
        (*pCVar9->_vptr_Compressor[6])(pCVar9,rawPixelData + 0x1c,uVar3 & 0xffffffff,(ulong)uVar1);
      }
      else {
        local_1b8[0] = rawPixelData + 0x1c;
        pCVar9 = (Compressor *)0x0;
      }
      pSVar10 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      pcVar4 = pSVar10->base;
      pSVar10 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      sVar5 = pSVar10->xStride;
      pSVar10 = DeepFrameBuffer::getSampleCountSlice(frameBuffer);
      if (scanLine1 <= scanLine2) {
        sVar7 = pSVar10->yStride;
        pDVar2 = local_1c0->_data;
        lVar15 = (long)scanLine1;
        pcVar14 = local_1b8[0];
        do {
          if (pDVar2->minX <= pDVar2->maxX) {
            lVar16 = (long)pDVar2->minX;
            iVar18 = 0;
            do {
              lVar17 = 0;
              pcVar13 = pcVar14;
              do {
                pcVar14 = pcVar13 + 1;
                local_1b8[0] = pcVar14;
                *(char *)((long)&local_1c4 + lVar17) = *pcVar13;
                lVar17 = lVar17 + 1;
                pcVar13 = pcVar14;
              } while ((int)lVar17 != 4);
              if (pDVar2->minX == (int)lVar16) {
                iVar18 = 0;
              }
              *(int *)(pcVar4 + (int)sVar5 * lVar16 + (int)sVar7 * lVar15) = local_1c4 - iVar18;
              bVar6 = lVar16 < pDVar2->maxX;
              lVar16 = lVar16 + 1;
              iVar18 = local_1c4;
            } while (bVar6);
          }
          lVar15 = lVar15 + 1;
        } while (scanLine2 + 1 != (int)lVar15);
      }
      if (pCVar9 != (Compressor *)0x0) {
        (*pCVar9->_vptr_Compressor[1])(pCVar9);
      }
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"readPixelSampleCounts(rawPixelData,frameBuffer,",0x2f);
    poVar11 = (ostream *)std::ostream::operator<<(local_1a8,scanLine1);
    local_1c4 = CONCAT31(local_1c4._1_3_,0x2c);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_1c4,1);
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,scanLine2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,") called with incorrect end scanline - should be ",0x31);
    std::ostream::operator<<(poVar11,iVar18);
    pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
    __cxa_throw(pAVar12,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"readPixelSampleCounts(rawPixelData,frameBuffer,",0x2f);
  poVar11 = (ostream *)std::ostream::operator<<(local_1a8,scanLine1);
  local_1c4 = CONCAT31(local_1c4._1_3_,0x2c);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_1c4,1);
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,scanLine2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,") called with incorrect start scanline - should be ",0x33);
  std::ostream::operator<<(poVar11,uVar1);
  pAVar12 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar12,(stringstream *)local_1b8);
  __cxa_throw(pAVar12,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void DeepScanLineInputFile::readPixelSampleCounts (const char* rawPixelData, 
                                                   const DeepFrameBuffer& frameBuffer, 
                                                   int scanLine1, 
                                                   int scanLine2) const
{
    //
    // read header from block - already converted from Xdr to native format
    //
    int data_scanline = *(int *) rawPixelData;
    Int64 sampleCountTableDataSize=*(Int64 *) (rawPixelData+4);
    
    
    int maxY;
    maxY = min(data_scanline + _data->linesInBuffer - 1, _data->maxY);
    
    if(scanLine1 != data_scanline)
    {
        THROW(IEX_NAMESPACE::ArgExc,"readPixelSampleCounts(rawPixelData,frameBuffer,"<< scanLine1 << ',' << scanLine2 << ") called with incorrect start scanline - should be " << data_scanline );
    }
    
    if(scanLine2 != maxY)
    {
        THROW(IEX_NAMESPACE::ArgExc,"readPixelSampleCounts(rawPixelData,frameBuffer,"<< scanLine1 << ',' << scanLine2 << ") called with incorrect end scanline - should be " << maxY );
    }
    
    
    //
    // If the sample count table is compressed, we'll uncompress it.
    //
    
    Int64 rawSampleCountTableSize = (maxY - data_scanline + 1) * (_data->maxX - _data->minX + 1) *
    Xdr::size <unsigned int> ();
    
    
    Compressor * decomp=NULL;
    const char* readPtr;
    if (sampleCountTableDataSize < rawSampleCountTableSize)
    {
        decomp = newCompressor(_data->header.compression(),
                               rawSampleCountTableSize,
                               _data->header);
                                                    
        decomp->uncompress(rawPixelData+28,
                                               sampleCountTableDataSize,
                                               data_scanline,
                                               readPtr);
    }
    else readPtr = rawPixelData+28;
    
    char* base = frameBuffer.getSampleCountSlice().base;
    int xStride = frameBuffer.getSampleCountSlice().xStride;
    int yStride = frameBuffer.getSampleCountSlice().yStride;
    
   
    
    for (int y = scanLine1; y <= scanLine2; y++)
    {
        int lastAccumulatedCount = 0;
        for (int x = _data->minX; x <= _data->maxX; x++)
        {
            int accumulatedCount, count;
            
            //
            // Read the sample count for pixel (x, y).
            //
            
            Xdr::read <CharPtrIO> (readPtr, accumulatedCount);
            if (x == _data->minX)
                count = accumulatedCount;
            else
                count = accumulatedCount - lastAccumulatedCount;
            lastAccumulatedCount = accumulatedCount;
            
            //
            // Store the data in both internal and external data structure.
            //
            
            sampleCount(base, xStride, yStride, x, y) = count;
        }
    }
    
    if(decomp)
    {
       delete decomp;
    }
}